

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_successWithOutputParameterOfType_Test::
TEST_MockSupport_c_successWithOutputParameterOfType_Test
          (TEST_MockSupport_c_successWithOutputParameterOfType_Test *this)

{
  TEST_MockSupport_c_successWithOutputParameterOfType_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockSupport_c::TEST_GROUP_CppUTestGroupMockSupport_c
            (&this->super_TEST_GROUP_CppUTestGroupMockSupport_c);
  (this->super_TEST_GROUP_CppUTestGroupMockSupport_c).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockSupport_c_successWithOutputParameterOfType_Test_0034cd98;
  return;
}

Assistant:

TEST(MockSupport_c, successWithOutputParameterOfType)
{
    TestTestingFixture fixture;
    mock_c()->installCopier("intType", typeCopy);
    fixture.setTestFunction(callToMockCWithOutputParameterOfType_);
    fixture.runAllTests();
    LONGS_EQUAL(2, fixture.getCheckCount());
    LONGS_EQUAL(0, fixture.getFailureCount());
    mock_c()->removeAllComparatorsAndCopiers();
}